

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int removeNode(Rtree *pRtree,RtreeNode *pNode,int iHeight)

{
  long lVar1;
  int iVar2;
  uint in_EDX;
  undefined8 *in_RSI;
  sqlite3_stmt *in_RDI;
  long in_FS_OFFSET;
  RtreeNode *pParent;
  int rc2;
  int rc;
  int iCell;
  RtreeNode *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  RtreeNode *pNode_00;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar3;
  int local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0xaaaaaaaa;
  pNode_00 = (RtreeNode *)0x0;
  local_10 = nodeParentIndex((Rtree *)0x0,
                             (RtreeNode *)
                             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                             (int *)in_stack_ffffffffffffffb8);
  if (local_10 == 0) {
    pNode_00 = (RtreeNode *)*in_RSI;
    *in_RSI = 0;
    local_10 = deleteCell((Rtree *)((ulong)in_EDX << 0x20),
                          (RtreeNode *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),
                          (int)((ulong)pNode_00 >> 0x20),(int)pNode_00);
  }
  iVar2 = nodeRelease((Rtree *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffb8);
  if (local_10 == 0) {
    local_10 = iVar2;
  }
  if (local_10 == 0) {
    sqlite3_bind_int64((sqlite3_stmt *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                       (int)((ulong)pNode_00 >> 0x20),
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    sqlite3_step(in_RDI);
    local_10 = sqlite3_reset((sqlite3_stmt *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
    if (local_10 == 0) {
      sqlite3_bind_int64((sqlite3_stmt *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                         (int)((ulong)pNode_00 >> 0x20),
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      sqlite3_step(in_RDI);
      local_10 = sqlite3_reset((sqlite3_stmt *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      if (local_10 == 0) {
        nodeHashDelete((Rtree *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),pNode_00);
        in_RSI[1] = (long)(int)in_EDX;
        in_RSI[4] = *(undefined8 *)(in_RDI + 0x68);
        *(int *)(in_RSI + 2) = *(int *)(in_RSI + 2) + 1;
        *(undefined8 **)(in_RDI + 0x68) = in_RSI;
        local_10 = 0;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

static int removeNode(Rtree *pRtree, RtreeNode *pNode, int iHeight){
  int rc;
  int rc2;
  RtreeNode *pParent = 0;
  int iCell;

  assert( pNode->nRef==1 );

  /* Remove the entry in the parent cell. */
  rc = nodeParentIndex(pRtree, pNode, &iCell);
  if( rc==SQLITE_OK ){
    pParent = pNode->pParent;
    pNode->pParent = 0;
    rc = deleteCell(pRtree, pParent, iCell, iHeight+1);
    testcase( rc!=SQLITE_OK );
  }
  rc2 = nodeRelease(pRtree, pParent);
  if( rc==SQLITE_OK ){
    rc = rc2;
  }
  if( rc!=SQLITE_OK ){
    return rc;
  }

  /* Remove the xxx_node entry. */
  sqlite3_bind_int64(pRtree->pDeleteNode, 1, pNode->iNode);
  sqlite3_step(pRtree->pDeleteNode);
  if( SQLITE_OK!=(rc = sqlite3_reset(pRtree->pDeleteNode)) ){
    return rc;
  }

  /* Remove the xxx_parent entry. */
  sqlite3_bind_int64(pRtree->pDeleteParent, 1, pNode->iNode);
  sqlite3_step(pRtree->pDeleteParent);
  if( SQLITE_OK!=(rc = sqlite3_reset(pRtree->pDeleteParent)) ){
    return rc;
  }

  /* Remove the node from the in-memory hash table and link it into
  ** the Rtree.pDeleted list. Its contents will be re-inserted later on.
  */
  nodeHashDelete(pRtree, pNode);
  pNode->iNode = iHeight;
  pNode->pNext = pRtree->pDeleted;
  pNode->nRef++;
  pRtree->pDeleted = pNode;

  return SQLITE_OK;
}